

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Environmental_Process_PDU::Decode
          (Environmental_Process_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  KException *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  pointer pKVar6;
  KUINT32 ui32RecType;
  KString local_58;
  uint local_34;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (iVar4 + (uint)KVar3 < 0x20) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
    KException::KException(this_00,&local_58,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar1 = (this->m_vEnvRecords).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vEnvRecords).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar6 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar6->_vptr_KRef_Ptr)(pKVar6);
      pKVar6 = pKVar6 + 1;
    } while (pKVar6 != pKVar2);
    (this->m_vEnvRecords).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_EnvProcID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EnvProcID,stream);
  (*(this->m_EnvType).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EnvType,stream);
  KDataStream::Read(stream,&this->m_ui8ModelType);
  KDataStream::Read(stream,&(this->field_3).m_ui8EnvStatus);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumEnvRec);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16SeqNum);
  if (this->m_ui16NumEnvRec != 0) {
    uVar5 = 0;
    do {
      KVar3 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read<unsigned_int>(stream,&local_34);
      KDataStream::SetCurrentWritePosition(stream,KVar3);
      DATA_TYPE::EnvironmentRecord::FactoryDecodeEnvironmentRecord
                ((EnvironmentRecordPtr *)&local_58,stream);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>>>
                  *)&this->m_vEnvRecords,(KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord> *)&local_58);
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00223280;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord> *)&local_58);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->m_ui16NumEnvRec);
  }
  return;
}

Assistant:

void Environmental_Process_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ENVIROMENTAL_PROCESS_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vEnvRecords.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EnvProcID
           >> KDIS_STREAM m_EnvType
           >> m_ui8ModelType
           >> m_ui8EnvStatus
           >> m_ui16NumEnvRec
           >> m_ui16SeqNum;

    for( KUINT16 i = 0; i < m_ui16NumEnvRec; ++i )
    {
        // We now need to "peak" at the next 4 bytes to determine the Environment Record type,
        // once we have determined the type we need to return the buffers write positon as this
        // field needs to be re-read by the decode function of the derived Environment Record.
        KUINT16 ui16CurrentWritePos = stream.GetCurrentWritePosition();

        KUINT32 ui32RecType;
        stream >> ui32RecType;

        // We now know what type of record we should create, we need to reset the buffer so this value can be re-read.
        stream.SetCurrentWritePosition( ui16CurrentWritePos );

        m_vEnvRecords.push_back( EnvironmentRecord::FactoryDecodeEnvironmentRecord( stream ) );
    }
}